

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_htable_dict.c
# Opt level: O3

char ** ares_htable_dict_keys(ares_htable_dict_t *htable,size_t *num)

{
  void **p;
  char **arrp;
  char *pcVar1;
  ulong uVar2;
  size_t cnt;
  size_t local_28;
  
  local_28 = 0;
  if (num != (size_t *)0x0 && htable != (ares_htable_dict_t *)0x0) {
    *num = 0;
    p = ares_htable_all_buckets(htable->hash,&local_28);
    if (local_28 != 0 && p != (void **)0x0) {
      arrp = (char **)ares_malloc_zero(local_28 << 3);
      if (arrp != (char **)0x0) {
        if (local_28 != 0) {
          uVar2 = 0;
          do {
            pcVar1 = ares_strdup(*p[uVar2]);
            arrp[uVar2] = pcVar1;
            if (pcVar1 == (char *)0x0) goto LAB_0011b361;
            uVar2 = uVar2 + 1;
          } while (uVar2 < local_28);
        }
        ares_free(p);
        *num = local_28;
        return arrp;
      }
LAB_0011b361:
      *num = 0;
      ares_free_array(arrp,local_28,ares_free);
    }
  }
  return (char **)0x0;
}

Assistant:

char **ares_htable_dict_keys(const ares_htable_dict_t *htable, size_t *num)
{
  const void **buckets = NULL;
  size_t       cnt     = 0;
  char       **out     = NULL;
  size_t       i;

  if (htable == NULL || num == NULL) {
    return NULL; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  *num = 0;

  buckets = ares_htable_all_buckets(htable->hash, &cnt);
  if (buckets == NULL || cnt == 0) {
    return NULL;
  }

  out = ares_malloc_zero(sizeof(*out) * cnt);
  if (out == NULL) {
    goto fail; /* LCOV_EXCL_LINE: OutOfMemory */
  }

  for (i = 0; i < cnt; i++) {
    out[i] = ares_strdup(((const ares_htable_dict_bucket_t *)buckets[i])->key);
    if (out[i] == NULL) {
      goto fail;
    }
  }

  ares_free(buckets);
  *num = cnt;
  return out;

fail:
  *num = 0;
  ares_free_array(out, cnt, ares_free);
  return NULL;
}